

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O0

void iniparser_dump_ini(dictionary *d,FILE *f)

{
  int iVar1;
  char *s;
  char *secname;
  int nsec;
  int i;
  FILE *f_local;
  dictionary *d_local;
  
  if ((d != (dictionary *)0x0) && (f != (FILE *)0x0)) {
    iVar1 = iniparser_getnsec(d);
    if (iVar1 < 1) {
      for (secname._4_4_ = 0; (long)secname._4_4_ < d->size; secname._4_4_ = secname._4_4_ + 1) {
        if (d->key[secname._4_4_] != (char *)0x0) {
          fprintf((FILE *)f,"%s = %s\n",d->key[secname._4_4_],d->val[secname._4_4_]);
        }
      }
    }
    else {
      for (secname._4_4_ = 0; secname._4_4_ < iVar1; secname._4_4_ = secname._4_4_ + 1) {
        s = iniparser_getsecname(d,secname._4_4_);
        iniparser_dumpsection_ini(d,s,f);
      }
      fprintf((FILE *)f,"\n");
    }
  }
  return;
}

Assistant:

void iniparser_dump_ini(const dictionary * d, FILE * f)
{
    int          i ;
    int          nsec ;
    const char * secname ;

    if (d==NULL || f==NULL) return ;

    nsec = iniparser_getnsec(d);
    if (nsec<1) {
        /* No section in file: dump all keys as they are */
        for (i=0 ; i<d->size ; i++) {
            if (d->key[i]==NULL)
                continue ;
            fprintf(f, "%s = %s\n", d->key[i], d->val[i]);
        }
        return ;
    }
    for (i=0 ; i<nsec ; i++) {
        secname = iniparser_getsecname(d, i) ;
        iniparser_dumpsection_ini(d, secname, f);
    }
    fprintf(f, "\n");
    return ;
}